

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadNodeGeometry(ColladaParser *this,Node *pNode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int *p_Var2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *pmVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar6;
  string group;
  SemanticMappingTable s;
  MeshInstance instance;
  key_type local_f0;
  SemanticMappingTable local_d0;
  value_type local_80;
  
  GetAttribute(this,"url");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
  if (*(char *)CONCAT44(extraout_var,iVar3) != '#') {
    local_80.mMeshOrController._M_dataplus._M_p = (pointer)&local_80.mMeshOrController.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Unknown reference format","");
    ThrowException(this,&local_80.mMeshOrController);
  }
  local_80.mMeshOrController._M_dataplus._M_p = (pointer)&local_80.mMeshOrController.field_2;
  local_80.mMeshOrController._M_string_length = 0;
  local_80.mMeshOrController.field_2._M_local_buf[0] = '\0';
  local_80.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80.mMaterials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar6 = (char *)CONCAT44(extraout_var,iVar3) + 1;
  local_80.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80.mMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar6);
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar3 == '\0') {
    paVar1 = &local_d0.mMatName.field_2;
    do {
      do {
        while( true ) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar3 == '\0') goto LAB_003bcd3b;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          p_Var2 = this->mReader->_vptr_IIrrXMLReader[3];
          if (iVar3 != 1) break;
          iVar3 = (*p_Var2)();
          if (iVar3 != 1) {
            __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                          ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
          }
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"instance_material");
          if (iVar3 == 0) {
            uVar4 = GetAttribute(this,"symbol");
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,(char *)CONCAT44(extraout_var_01,iVar3),
                       (allocator<char> *)&local_d0);
            GetAttribute(this,"target");
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            local_d0.mMatName._M_string_length = 0;
            local_d0.mMatName.field_2._M_local_buf[0] = '\0';
            local_d0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_d0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_d0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_d0.mMap._M_t._M_impl.super__Rb_tree_header._M_header;
            local_d0.mMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pcVar6 = (char *)CONCAT44(extraout_var_02,iVar3) +
                     (*(char *)CONCAT44(extraout_var_02,iVar3) == '#');
            local_d0.mMatName._M_dataplus._M_p = (pointer)paVar1;
            local_d0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_d0.mMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            strlen(pcVar6);
            std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)0x0,(ulong)pcVar6);
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((char)iVar3 == '\0') {
              ReadMaterialVertexInputBinding(this,&local_d0);
            }
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                     ::operator[](&local_80.mMaterials,&local_f0);
            std::__cxx11::string::_M_assign((string *)pmVar5);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
            ::operator=(&(pmVar5->mMap)._M_t,&local_d0.mMap._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
            ::~_Rb_tree(&local_d0.mMap._M_t);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0.mMatName._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0.mMatName._M_dataplus._M_p,
                              CONCAT71(local_d0.mMatName.field_2._M_allocated_capacity._1_7_,
                                       local_d0.mMatName.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
        }
        iVar3 = (*p_Var2)();
      } while (iVar3 != 2);
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"instance_geometry");
      if (iVar3 == 0) break;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"instance_controller");
    } while (iVar3 != 0);
  }
LAB_003bcd3b:
  std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
  push_back(&pNode->mMeshes,&local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
  ::~_Rb_tree(&local_80.mMaterials._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mMeshOrController._M_dataplus._M_p != &local_80.mMeshOrController.field_2) {
    operator_delete(local_80.mMeshOrController._M_dataplus._M_p,
                    CONCAT71(local_80.mMeshOrController.field_2._M_allocated_capacity._1_7_,
                             local_80.mMeshOrController.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ColladaParser::ReadNodeGeometry(Node* pNode)
{
    // referred mesh is given as an attribute of the <instance_geometry> element
    int attrUrl = GetAttribute("url");
    const char* url = mReader->getAttributeValue(attrUrl);
    if (url[0] != '#')
        ThrowException("Unknown reference format");

    Collada::MeshInstance instance;
    instance.mMeshOrController = url + 1; // skipping the leading #

    if (!mReader->isEmptyElement())
    {
        // read material associations. Ignore additional elements in between
        while (mReader->read())
        {
            if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
            {
                if (IsElement("instance_material"))
                {
                    // read ID of the geometry subgroup and the target material
                    int attrGroup = GetAttribute("symbol");
                    std::string group = mReader->getAttributeValue(attrGroup);
                    int attrMaterial = GetAttribute("target");
                    const char* urlMat = mReader->getAttributeValue(attrMaterial);
                    Collada::SemanticMappingTable s;
                    if (urlMat[0] == '#')
                        urlMat++;

                    s.mMatName = urlMat;

                    // resolve further material details + THIS UGLY AND NASTY semantic mapping stuff
                    if (!mReader->isEmptyElement())
                        ReadMaterialVertexInputBinding(s);

                    // store the association
                    instance.mMaterials[group] = s;
                }
            }
            else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
            {
                if (strcmp(mReader->getNodeName(), "instance_geometry") == 0
                    || strcmp(mReader->getNodeName(), "instance_controller") == 0)
                    break;
            }
        }
    }

    // store it
    pNode->mMeshes.push_back(instance);
}